

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O0

CameraSample * pbrt::GetCameraSample<pbrt::Sampler>(Sampler *sampler,Point2i pPixel,Filter *filter)

{
  Tuple2<pbrt::Point2,_float> TVar1;
  BasicPBRTOptions *pBVar2;
  Tuple2<pbrt::Point2,_float> in_RCX;
  CameraSample *in_RDI;
  Float FVar3;
  undefined1 auVar4 [64];
  undefined1 auVar10 [56];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  FilterSample FVar11;
  CameraSample *cs;
  FilterSample fs;
  float in_stack_ffffffffffffff58;
  float in_stack_ffffffffffffff5c;
  CameraSample *this;
  Tuple2<pbrt::Point2,_float> in_stack_ffffffffffffff80;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  
  this = in_RDI;
  auVar4._0_8_ = Sampler::GetPixel2D((Sampler *)
                                     CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  auVar4._8_56_ = extraout_var;
  vmovlpd_avx(auVar4._0_16_);
  auVar10 = ZEXT856(0);
  FVar11 = Filter::Sample((Filter *)this,(Point2f)in_stack_ffffffffffffff80);
  auVar5._0_8_ = FVar11.p.super_Tuple2<pbrt::Point2,_float>;
  auVar5._8_56_ = auVar10;
  vmovlpd_avx(auVar5._0_16_);
  CameraSample::CameraSample(in_RDI);
  auVar6._0_8_ = Tuple2<pbrt::Point2,int>::operator+((Tuple2<pbrt::Point2,_int> *)in_RDI,in_RCX);
  auVar6._8_56_ = extraout_var_00;
  vmovlpd_avx(auVar6._0_16_);
  Vector2<float>::Vector2
            ((Vector2<float> *)in_RDI,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
  auVar7._0_8_ = Point2<float>::operator+(&in_RDI->pFilm,in_RCX);
  auVar7._8_56_ = extraout_var_01;
  TVar1 = (Tuple2<pbrt::Point2,_float>)vmovlpd_avx(auVar7._0_16_);
  (this->pFilm).super_Tuple2<pbrt::Point2,_float> = TVar1;
  FVar3 = Sampler::Get1D((Sampler *)in_RDI);
  this->time = FVar3;
  auVar8._0_8_ = Sampler::Get2D((Sampler *)
                                CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  auVar8._8_56_ = extraout_var_02;
  TVar1 = (Tuple2<pbrt::Point2,_float>)vmovlpd_avx(auVar8._0_16_);
  (this->pLens).super_Tuple2<pbrt::Point2,_float> = TVar1;
  this->filterWeight = FVar11.weight;
  pBVar2 = GetOptions();
  if ((pBVar2->disablePixelJitter & 1U) != 0) {
    Vector2<float>::Vector2
              ((Vector2<float> *)in_RDI,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
    auVar9._0_8_ = Point2<int>::operator+((Point2<int> *)in_RDI,in_RCX);
    auVar9._8_56_ = extraout_var_03;
    TVar1 = (Tuple2<pbrt::Point2,_float>)vmovlpd_avx(auVar9._0_16_);
    (this->pFilm).super_Tuple2<pbrt::Point2,_float> = TVar1;
    this->time = 0.5;
    Point2<float>::Point2(&in_RDI->pFilm,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
    (this->pLens).super_Tuple2<pbrt::Point2,_float> = in_stack_ffffffffffffff80;
    this->filterWeight = 1.0;
  }
  return in_RDI;
}

Assistant:

inline PBRT_CPU_GPU CameraSample GetCameraSample(S sampler, Point2i pPixel,
                                                 Filter filter) {
    FilterSample fs = filter.Sample(sampler.GetPixel2D());
    CameraSample cs;
    // Initialize _CameraSample_ member variables
    cs.pFilm = pPixel + fs.p + Vector2f(0.5f, 0.5f);
    cs.time = sampler.Get1D();
    cs.pLens = sampler.Get2D();
    cs.filterWeight = fs.weight;

    if (GetOptions().disablePixelJitter) {
        cs.pFilm = pPixel + Vector2f(0.5f, 0.5f);
        cs.time = 0.5f;
        cs.pLens = Point2f(0.5f, 0.5f);
        cs.filterWeight = 1;
    }
    return cs;
}